

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

void fixmap(KEYMAP *curmap,KEYMAP *mp,KEYMAP *mt)

{
  int iVar1;
  int local_24;
  int i;
  KEYMAP *mt_local;
  KEYMAP *mp_local;
  KEYMAP *curmap_local;
  
  local_24 = (int)mt->map_num;
  while (iVar1 = local_24 + -1, local_24 != 0) {
    local_24 = iVar1;
    if (mt->map_element[iVar1].k_prefmap != (keymap_s *)0x0) {
      if (mt->map_element[iVar1].k_prefmap == curmap) {
        mt->map_element[iVar1].k_prefmap = mp;
      }
      else {
        fixmap(curmap,mp,mt->map_element[iVar1].k_prefmap);
      }
    }
  }
  return;
}

Assistant:

static void
fixmap(KEYMAP *curmap, KEYMAP *mp, KEYMAP *mt)
{
	int	 i;

	for (i = mt->map_num; i--;) {
		if (mt->map_element[i].k_prefmap != NULL) {
			if (mt->map_element[i].k_prefmap == curmap)
				mt->map_element[i].k_prefmap = mp;
			else
				fixmap(curmap, mp, mt->map_element[i].k_prefmap);
		}
	}
}